

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DaTrie<true,_true,_false>::xcheck_in_block_
          (DaTrie<true,_true,_false> *this,Edge *edge,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  pointer pBVar3;
  ulong uVar4;
  pointer pBVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  bool bVar9;
  
  pBVar3 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = edge->size_;
  uVar7 = 0xffffffff;
  if (uVar4 <= pBVar3[block_pos].num_emps) {
    uVar2 = pBVar3[block_pos].head;
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = uVar2;
    do {
      uVar7 = uVar6 ^ edge->labels_[0];
      bVar9 = uVar4 == 0;
      if (uVar4 != 0) {
        if ((long)pBVar5[uVar6] < 0) {
          bVar9 = false;
        }
        else {
          uVar8 = 1;
          do {
            bVar9 = uVar4 == uVar8;
            if (bVar9) break;
            puVar1 = edge->labels_ + uVar8;
            uVar8 = uVar8 + 1;
          } while (-1 < (long)pBVar5[*puVar1 ^ uVar7]);
        }
      }
    } while ((!bVar9) &&
            (uVar6 = *(uint *)(pBVar5 + uVar6) & 0x7fffffff, uVar7 = 0xffffffff, uVar6 != uVar2));
  }
  return uVar7;
}

Assistant:

uint32_t xcheck_in_block_(const Edge& edge, uint32_t block_pos,
                            const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (blocks[block_pos].num_emps < edge.size()) {
      return NOT_FOUND;
    }

    auto head = blocks[block_pos].head;
    auto node_pos = head;

    do {
      auto base = node_pos ^*edge.begin();
      if (is_target_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head);

    return NOT_FOUND;
  }